

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::NurbsCurveGeometry<2L>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>
* __thiscall
pybind11::
class_<anurbs::NurbsCurveGeometry<2l>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>>
::def_property_readonly<bool(anurbs::NurbsCurveGeometry<2l>::*)()const>
          (class_<anurbs::NurbsCurveGeometry<2l>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>>
           *this,char *name,offset_in_Model_to_subr *fget)

{
  class_<anurbs::NurbsCurveGeometry<2L>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>
  *pcVar1;
  return_value_policy local_21;
  cpp_function local_20;
  
  cpp_function::cpp_function<bool,anurbs::NurbsCurveGeometry<2l>>(&local_20,*fget);
  local_21 = reference_internal;
  pcVar1 = class_<anurbs::NurbsCurveGeometry<2L>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>
           ::def_property_readonly<pybind11::return_value_policy>
                     ((class_<anurbs::NurbsCurveGeometry<2L>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>
                       *)this,name,&local_20,&local_21);
  pybind11::object::~object((object *)&local_20);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }